

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  Image *pIVar3;
  
  if (this->nAlloc < n) {
    if (n * 0x98 == 0) {
      pIVar3 = (Image *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0x98,8);
      pIVar3 = (Image *)CONCAT44(extraout_var,iVar2);
    }
    if (this->nStored != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
                  (&this->alloc,(Image *)((long)&pIVar3->format + lVar4),
                   (Image *)((long)&this->ptr->format + lVar4));
        pmr::polymorphic_allocator<pbrt::Image>::destroy<pbrt::Image>
                  (&this->alloc,(Image *)((long)&this->ptr->format + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x98;
      } while (uVar5 < this->nStored);
    }
    if (this->ptr != (Image *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x98,8);
    }
    this->nAlloc = n;
    this->ptr = pIVar3;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }